

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_union_vec_ref_t
flatcc_builder_create_union_vector_direct
          (flatcc_builder_t *B,flatcc_builder_utype_t *types,flatcc_builder_ref_t *data,size_t count
          )

{
  flatcc_builder_ref_t fVar1;
  flatcc_builder_ref_t fVar2;
  flatcc_builder_union_vec_ref_t fVar3;
  
  fVar1 = _create_offset_vector_direct(B,data,count,types);
  if (fVar1 == 0) {
    fVar2 = 0;
  }
  else {
    fVar2 = flatcc_builder_create_vector(B,types,count,1,1,0xffffffff);
  }
  fVar3.value = fVar1;
  fVar3.type = fVar2;
  return fVar3;
}

Assistant:

flatcc_builder_union_vec_ref_t flatcc_builder_create_union_vector_direct(flatcc_builder_t *B,
        const flatcc_builder_utype_t *types, flatcc_builder_ref_t *data, size_t count)
{
    flatcc_builder_union_vec_ref_t uvref = { 0, 0 };

    if (0 == (uvref.value = _create_offset_vector_direct(B, data, count, types))) {
        return uvref;
    }
    if (0 == (uvref.type = flatcc_builder_create_type_vector(B, types, count))) {
        return uvref;
    }
    return uvref;
}